

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

string * __thiscall
cfd::core::TapBranch::ToString_abi_cxx11_(string *__return_storage_ptr__,TapBranch *this)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  ByteData256 local_390;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  ByteData256 local_2d8;
  uchar *local_2c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *node_bytes;
  ByteData256 node;
  undefined1 local_220 [8];
  HashUtil hasher;
  TapBranch *branch;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *__range2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData tapbranch_base;
  string local_1a0 [32];
  undefined1 local_180 [8];
  ByteData256 hash;
  allocator local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ByteData local_b0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string ver_str;
  string buf;
  TapBranch *this_local;
  
  ::std::__cxx11::string::string((string *)(ver_str.field_2._M_local_buf + 8));
  if ((this->has_leaf_ & 1U) == 0) {
    bVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                      (&this->branch_list_);
    if ((bVar1) && (bVar1 = ByteData256::IsEmpty(&this->root_commitment_), bVar1)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_141);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_141);
      goto LAB_005b3018;
    }
    ByteData256::GetHex_abi_cxx11_
              ((string *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&this->root_commitment_);
    ::std::__cxx11::string::operator=
              ((string *)(ver_str.field_2._M_local_buf + 8),
               (string *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ::std::__cxx11::string::string((string *)local_58);
    if (this->leaf_version_ != 0xc0) {
      ByteData::ByteData(&local_b0,this->leaf_version_);
      ByteData::GetHex_abi_cxx11_(&local_98,&local_b0);
      ::std::operator+(&local_78,",",&local_98);
      ::std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_98);
      ByteData::~ByteData(&local_b0);
    }
    Script::GetHex_abi_cxx11_(&local_140,&this->script_);
    ::std::operator+(&local_120,"tl(",&local_140);
    ::std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    ::std::operator+(&local_e0,&local_100,")");
    ::std::__cxx11::string::operator=
              ((string *)(ver_str.field_2._M_local_buf + 8),(string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)local_58);
  }
  bVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (&this->branch_list_);
  if (bVar1) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(ver_str.field_2._M_local_buf + 8));
  }
  else {
    GetBaseHash((ByteData256 *)local_180,this);
    if ((ToString[abi:cxx11]()::kTaggedHash == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ToString[abi:cxx11]()::kTaggedHash), iVar2 != 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1a0,"TapBranch",
                 (allocator *)
                 ((long)&tapbranch_base.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      HashUtil::Sha256(&ToString::kTaggedHash,(string *)local_1a0);
      ::std::__cxx11::string::~string(local_1a0);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&tapbranch_base.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      __cxa_atexit(ByteData256::~ByteData256,&ToString::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&ToString[abi:cxx11]()::kTaggedHash);
    }
    ByteData256::Concat<cfd::core::ByteData256>
              ((ByteData *)
               &nodes.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&ToString::kTaggedHash,
               &ToString::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&__range2);
    __end2 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::begin
                       (&this->branch_list_);
    branch = (TapBranch *)
             ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::end
                       (&this->branch_list_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                                       *)&branch), bVar1) {
      hasher.buffer_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                    ::operator*(&__end2);
      HashUtil::HashUtil((HashUtil *)
                         &node.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,'\x03');
      pHVar3 = HashUtil::operator<<
                         ((HashUtil *)
                          &node.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                          (ByteData *)
                          &nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      HashUtil::HashUtil((HashUtil *)local_220,pHVar3);
      HashUtil::~HashUtil((HashUtil *)
                          &node.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      GetCurrentBranchHash
                ((ByteData256 *)&node_bytes,
                 (TapBranch *)
                 hasher.buffer_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_bytes,
                 (ByteData256 *)&node_bytes);
      local_268 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_bytes;
      ByteData256::GetBytes(&local_2a0,(ByteData256 *)local_180);
      local_288 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a0;
      local_2a8._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_288);
      local_2b0._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_288);
      local_2b8._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_268);
      local_2c0 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     (local_268);
      bVar1 = ::std::
              lexicographical_compare<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_2a8,local_2b0,local_2b8,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_2c0);
      if (bVar1) {
        pHVar3 = HashUtil::operator<<((HashUtil *)local_220,(ByteData256 *)local_180);
        pHVar3 = HashUtil::operator<<(pHVar3,(ByteData256 *)&node_bytes);
        HashUtil::Output256(&local_2d8,pHVar3);
        ByteData256::operator=((ByteData256 *)local_180,&local_2d8);
        ByteData256::~ByteData256(&local_2d8);
        ::std::operator+(&local_358,"{",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&ver_str.field_2 + 8));
        ::std::operator+(&local_338,&local_358,",");
        ToString_abi_cxx11_(&local_378,
                            (TapBranch *)
                            hasher.buffer_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::operator+(&local_318,&local_338,&local_378);
        ::std::operator+(&local_2f8,&local_318,"}");
        ::std::__cxx11::string::operator=
                  ((string *)(ver_str.field_2._M_local_buf + 8),(string *)&local_2f8);
        ::std::__cxx11::string::~string((string *)&local_2f8);
        ::std::__cxx11::string::~string((string *)&local_318);
        ::std::__cxx11::string::~string((string *)&local_378);
        ::std::__cxx11::string::~string((string *)&local_338);
        ::std::__cxx11::string::~string((string *)&local_358);
      }
      else {
        pHVar3 = HashUtil::operator<<((HashUtil *)local_220,(ByteData256 *)&node_bytes);
        pHVar3 = HashUtil::operator<<(pHVar3,(ByteData256 *)local_180);
        HashUtil::Output256(&local_390,pHVar3);
        ByteData256::operator=((ByteData256 *)local_180,&local_390);
        ByteData256::~ByteData256(&local_390);
        ToString_abi_cxx11_(&local_430,
                            (TapBranch *)
                            hasher.buffer_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::operator+(&local_410,"{",&local_430);
        ::std::operator+(&local_3f0,&local_410,",");
        ::std::operator+(&local_3d0,&local_3f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&ver_str.field_2 + 8));
        ::std::operator+(&local_3b0,&local_3d0,"}");
        ::std::__cxx11::string::operator=
                  ((string *)(ver_str.field_2._M_local_buf + 8),(string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_410);
        ::std::__cxx11::string::~string((string *)&local_430);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_bytes);
      ByteData256::~ByteData256((ByteData256 *)&node_bytes);
      HashUtil::~HashUtil((HashUtil *)local_220);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
      ::operator++(&__end2);
    }
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(ver_str.field_2._M_local_buf + 8));
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&__range2)
    ;
    ByteData::~ByteData((ByteData *)
                        &nodes.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ByteData256::~ByteData256((ByteData256 *)local_180);
  }
LAB_005b3018:
  ::std::__cxx11::string::~string((string *)(ver_str.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TapBranch::ToString() const {
  std::string buf;
  if (has_leaf_) {
    std::string ver_str;
    if (leaf_version_ != TaprootScriptTree::kTapScriptLeafVersion) {
      ver_str = "," + ByteData(leaf_version_).GetHex();
    }
    buf = "tl(" + script_.GetHex() + ver_str + ")";
  } else if (branch_list_.empty() && root_commitment_.IsEmpty()) {
    return "";
  } else {
    buf = root_commitment_.GetHex();
  }
  if (branch_list_.empty()) return buf;

  ByteData256 hash = GetBaseHash();
  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  for (const auto& branch : branch_list_) {
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto node = branch.GetCurrentBranchHash();
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
      buf = "{" + buf + "," + branch.ToString() + "}";
    } else {
      hash = (hasher << node << hash).Output256();
      buf = "{" + branch.ToString() + "," + buf + "}";
    }
  }
  return buf;
}